

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_22::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  ostream *poVar1;
  ostream *poVar2;
  char *_escapeCode_local;
  PosixColourImpl *this_local;
  
  poVar1 = cout();
  poVar2 = std::operator<<((ostream *)poVar1,'\x1b');
  std::operator<<(poVar2,_escapeCode);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            Catch::cout() << '\033' << _escapeCode;
        }